

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibCellProfile(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,int nFanins,int *Perm,
                       int *pProf)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = 0;
  iVar4 = 0;
  if (pCellTop != (Mio_Cell2_t *)0x0) {
    iVar4 = (int)pCellTop->Delays[InTop];
  }
  uVar2 = (ulong)(uint)nFanins;
  if (nFanins < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    iVar5 = Perm[uVar1];
    uVar3 = *(uint *)&pCellBot->field_0x10 >> 0x1c;
    if (iVar5 < (int)uVar3) {
      iVar5 = (int)pCellBot->Delays[iVar5] + iVar4;
    }
    else {
      if (iVar5 < (int)(uVar3 + InTop)) {
        iVar5 = iVar5 - uVar3;
      }
      else {
        iVar5 = (iVar5 - uVar3) + 1;
      }
      iVar5 = (int)pCellTop->Delays[iVar5];
    }
    pProf[uVar1] = iVar5;
  }
  return;
}

Assistant:

void Sfm_LibCellProfile( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, int nFanins, int * Perm, int * pProf )
{
    int i, DelayAdd = (int)(pCellTop ? pCellTop->Delays[InTop] : 0);
    for ( i = 0; i < nFanins; i++ )
        if ( Perm[i] < (int)pCellBot->nFanins )
            pProf[i] = (int)pCellBot->Delays[Perm[i]] + DelayAdd;
        else if ( Perm[i] < (int)pCellBot->nFanins + InTop )
            pProf[i] = (int)pCellTop->Delays[Perm[i] - (int)pCellBot->nFanins];
        else // if ( Perm[i] >= (int)pCellBot->nFanins + InTop )
            pProf[i] = (int)pCellTop->Delays[Perm[i] - (int)pCellBot->nFanins + 1];
}